

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

bool __thiscall
DynamicProfileStorageReaderWriter::WriteArray<char_const>
          (DynamicProfileStorageReaderWriter *this,char *t,size_t len)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  size_t len_local;
  char *t_local;
  DynamicProfileStorageReaderWriter *this_local;
  
  if (this->file == (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x97,"(file)","file");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  sVar4 = PAL_fwrite(t,1,len,this->file);
  if (sVar4 != len) {
    Output::Print(L"ERROR: DynamicProfileStorage: Unable to write to file \'%s\'\n",this->filename);
    Output::Flush();
  }
  return sVar4 == len;
}

Assistant:

bool DynamicProfileStorageReaderWriter::WriteArray(T * t, size_t len)
{
    AssertOrFailFast(file);
    if (fwrite(t, sizeof(T), len, file) != len)
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: Unable to write to file '%s'\n"), filename);
        Output::Flush();
        return false;
    }
    return true;
}